

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O0

sftp_command * sftp_getcmd(FILE *fp,int mode,int modeflags)

{
  size_t sVar1;
  sftp_command *psVar2;
  size_t sVar3;
  char **ppcVar4;
  char *pcVar5;
  sftp_cmd_lookup *psVar6;
  bool bVar7;
  sftp_cmd_lookup *lookup;
  char *pcStack_48;
  _Bool quoting;
  char *r;
  char *q;
  char *p;
  sftp_command *cmd;
  char *line;
  int modeflags_local;
  int mode_local;
  FILE *fp_local;
  
  psVar2 = (sftp_command *)safemalloc(1,0x20,0);
  psVar2->words = (char **)0x0;
  psVar2->nwords = 0;
  psVar2->wordssize = 0;
  if (fp == (FILE *)0x0) {
    cmd = (sftp_command *)
          ssh_sftp_get_cmdline("psftp> ",(_Bool)((backend != (Backend *)0x0 ^ 0xffU) & 1));
  }
  else {
    if ((modeflags & 1U) != 0) {
      printf("psftp> ");
    }
    cmd = (sftp_command *)fgetline(fp);
  }
  if ((cmd == (sftp_command *)0x0) || (*(char *)&cmd->words == '\0')) {
    psVar2->obey = sftp_cmd_quit;
    if ((mode == 0) || ((modeflags & 1U) != 0)) {
      printf("quit\n");
    }
    safefree(cmd);
  }
  else {
    sVar3 = strcspn((char *)cmd,"\r\n");
    *(undefined1 *)((long)&cmd->words + sVar3) = 0;
    if ((modeflags & 1U) != 0) {
      printf("%s\n",cmd);
    }
    q = (char *)cmd;
    while( true ) {
      bVar7 = false;
      if ((*q != '\0') && (bVar7 = true, *q != ' ')) {
        bVar7 = *q == '\t';
      }
      if (!bVar7) break;
      q = q + 1;
    }
    if (*q == '!') {
      psVar2->nwords = 2;
      ppcVar4 = (char **)safegrowarray(psVar2->words,&psVar2->wordssize,8,psVar2->nwords,0,false);
      psVar2->words = ppcVar4;
      pcVar5 = dupstr("!");
      *psVar2->words = pcVar5;
      pcVar5 = dupstr(q + 1);
      psVar2->words[1] = pcVar5;
    }
    else if (*q == '#') {
      psVar2->wordssize = 0;
      psVar2->nwords = 0;
    }
    else {
      while( true ) {
        while( true ) {
          pcVar5 = q;
          bVar7 = false;
          if ((*q != '\0') && (bVar7 = true, *q != ' ')) {
            bVar7 = *q == '\t';
          }
          if (!bVar7) break;
          q = q + 1;
        }
        if (*q == '\0') break;
        pcStack_48 = q;
        bVar7 = false;
        while ((*q != '\0' && ((bVar7 || ((*q != ' ' && (*q != '\t'))))))) {
          if ((*q == '\"') && (q[1] == '\"')) {
            q = q + 2;
            *pcStack_48 = '\"';
            pcStack_48 = pcStack_48 + 1;
          }
          else {
            if (*q == '\"') {
              bVar7 = (bool)(bVar7 ^ 1);
            }
            else {
              *pcStack_48 = *q;
              pcStack_48 = pcStack_48 + 1;
            }
            q = q + 1;
          }
        }
        if (*q != '\0') {
          q = q + 1;
        }
        *pcStack_48 = '\0';
        ppcVar4 = (char **)safegrowarray(psVar2->words,&psVar2->wordssize,8,psVar2->nwords,1,false);
        psVar2->words = ppcVar4;
        pcVar5 = dupstr(pcVar5);
        sVar1 = psVar2->nwords;
        psVar2->nwords = sVar1 + 1;
        psVar2->words[sVar1] = pcVar5;
      }
    }
    safefree(cmd);
    if (psVar2->nwords == 0) {
      psVar2->obey = sftp_cmd_null;
    }
    else {
      psVar6 = lookup_command(*psVar2->words);
      if (psVar6 == (sftp_cmd_lookup *)0x0) {
        psVar2->obey = sftp_cmd_unknown;
      }
      else {
        psVar2->obey = psVar6->obey;
      }
    }
  }
  return psVar2;
}

Assistant:

struct sftp_command *sftp_getcmd(FILE *fp, int mode, int modeflags)
{
    char *line;
    struct sftp_command *cmd;
    char *p, *q, *r;
    bool quoting;

    cmd = snew(struct sftp_command);
    cmd->words = NULL;
    cmd->nwords = 0;
    cmd->wordssize = 0;

    line = NULL;

    if (fp) {
        if (modeflags & 1)
            printf("psftp> ");
        line = fgetline(fp);
    } else {
        line = ssh_sftp_get_cmdline("psftp> ", !backend);
    }

    if (!line || !*line) {
        cmd->obey = sftp_cmd_quit;
        if ((mode == 0) || (modeflags & 1))
            printf("quit\n");
        sfree(line);
        return cmd;                    /* eof */
    }

    line[strcspn(line, "\r\n")] = '\0';

    if (modeflags & 1) {
        printf("%s\n", line);
    }

    p = line;
    while (*p && (*p == ' ' || *p == '\t'))
        p++;

    if (*p == '!') {
        /*
         * Special case: the ! command. This is always parsed as
         * exactly two words: one containing the !, and the second
         * containing everything else on the line.
         */
        cmd->nwords = 2;
        sgrowarrayn(cmd->words, cmd->wordssize, cmd->nwords, 0);
        cmd->words[0] = dupstr("!");
        cmd->words[1] = dupstr(p+1);
    } else if (*p == '#') {
        /*
         * Special case: comment. Entire line is ignored.
         */
        cmd->nwords = cmd->wordssize = 0;
    } else {

        /*
         * Parse the command line into words. The syntax is:
         *  - double quotes are removed, but cause spaces within to be
         *    treated as non-separating.
         *  - a double-doublequote pair is a literal double quote, inside
         *    _or_ outside quotes. Like this:
         *
         *      firstword "second word" "this has ""quotes"" in" and""this""
         *
         * becomes
         *
         *      >firstword<
         *      >second word<
         *      >this has "quotes" in<
         *      >and"this"<
         */
        while (1) {
            /* skip whitespace */
            while (*p && (*p == ' ' || *p == '\t'))
                p++;
            /* terminate loop */
            if (!*p)
                break;
            /* mark start of word */
            q = r = p;                 /* q sits at start, r writes word */
            quoting = false;
            while (*p) {
                if (!quoting && (*p == ' ' || *p == '\t'))
                    break;                     /* reached end of word */
                else if (*p == '"' && p[1] == '"')
                    p += 2, *r++ = '"';    /* a literal quote */
                else if (*p == '"')
                    p++, quoting = !quoting;
                else
                    *r++ = *p++;
            }
            if (*p)
                p++;                   /* skip over the whitespace */
            *r = '\0';
            sgrowarray(cmd->words, cmd->wordssize, cmd->nwords);
            cmd->words[cmd->nwords++] = dupstr(q);
        }
    }

    sfree(line);

    /*
     * Now parse the first word and assign a function.
     */

    if (cmd->nwords == 0)
        cmd->obey = sftp_cmd_null;
    else {
        const struct sftp_cmd_lookup *lookup;
        lookup = lookup_command(cmd->words[0]);
        if (!lookup)
            cmd->obey = sftp_cmd_unknown;
        else
            cmd->obey = lookup->obey;
    }

    return cmd;
}